

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

date_t duckdb::LastDayOperator::Operation<duckdb::date_t,duckdb::date_t>(date_t input)

{
  date_t dVar1;
  date_t in_EDI;
  int32_t dd;
  int32_t mm;
  int32_t yyyy;
  date_t *in_stack_ffffffffffffffd8;
  int local_14;
  int local_10;
  int local_c [3];
  
  duckdb::Date::Convert(in_EDI,local_c,&local_10,&local_14);
  local_c[0] = local_10 / 0xc + local_c[0];
  local_10 = local_10 % 0xc + 1;
  duckdb::Date::FromDate(local_c[0],local_10,1);
  dVar1 = date_t::operator-(in_stack_ffffffffffffffd8,(int32_t *)0xc20ff4);
  return (date_t)dVar1.days;
}

Assistant:

static inline TR Operation(TA input) {
		int32_t yyyy, mm, dd;
		Date::Convert(input, yyyy, mm, dd);
		yyyy += (mm / 12);
		mm %= 12;
		++mm;
		return Date::FromDate(yyyy, mm, 1) - 1;
	}